

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManLutNum(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = p->nObjs;
  iVar2 = 0;
  if (1 < (long)iVar1) {
    iVar2 = p->vMapping->nSize;
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    if (iVar3 - 1U <= iVar1 - 2U) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = 0;
    lVar4 = 1;
    do {
      iVar2 = (iVar2 + 1) - (uint)(p->vMapping->pArray[lVar4] == 0);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return iVar2;
}

Assistant:

int Gia_ManLutNum( Gia_Man_t * p )
{
    int i, Counter = 0;
    Gia_ManForEachLut( p, i )
        Counter ++;
    return Counter;
}